

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# book.hpp
# Opt level: O2

void __thiscall Excel::Book::onCell(Book *this,size_t sheetIdx,Formula *formula)

{
  short sVar1;
  short sVar2;
  Sheet *this_00;
  undefined1 auStack_68 [64];
  
  this_00 = sheet(this,sheetIdx);
  sVar1 = formula->m_row;
  sVar2 = formula->m_column;
  Formula::Formula((Formula *)auStack_68,formula);
  Sheet::setCell<Excel::Formula>(this_00,(long)sVar1,(long)sVar2,(Formula *)auStack_68);
  std::__cxx11::wstring::~wstring((wstring *)(auStack_68 + 0x18));
  return;
}

Assistant:

inline void
Book::onCell( size_t sheetIdx, const Formula & formula )
{
	sheet( sheetIdx )->setCell( formula.getRow(), formula.getColumn(), formula );
}